

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O0

Span * __thiscall tcmalloc::PageHeap::SearchFreeAndLargeLists(PageHeap *this,Length n)

{
  bool bVar1;
  Span *pSVar2;
  Span *ll;
  Length s;
  Length n_local;
  PageHeap *this_local;
  
  ll = (Span *)n;
  while( true ) {
    if ((Span *)0x80 < ll) {
      pSVar2 = AllocLarge(this,n);
      return pSVar2;
    }
    bVar1 = DLL_IsEmpty(&this->free_[(long)&ll[-1].field_0x2f].normal);
    if (!bVar1) break;
    bVar1 = DLL_IsEmpty((Span *)(Static::pageheap_ +
                                (long)((this->pagemap_cache_).array_ +
                                      (long)&ll[-1].field_0x2f * 0xc + 0x20e4)));
    if (((!bVar1) && (bVar1 = EnsureLimit(this,n,true), bVar1)) &&
       (bVar1 = DLL_IsEmpty((Span *)(Static::pageheap_ +
                                    (long)((this->pagemap_cache_).array_ +
                                          (long)&ll[-1].field_0x2f * 0xc + 0x20e4))), !bVar1)) {
      pSVar2 = Carve(this,*(Span **)(Static::pageheap_ +
                                    (long)((this->pagemap_cache_).array_ +
                                          (long)&ll[-1].field_0x2f * 0xc + 0x20e6)),n);
      return pSVar2;
    }
    ll = (Span *)((long)&ll->start + 1);
  }
  pSVar2 = Carve(this,this->free_[(long)&ll[-1].field_0x2f].normal.next,n);
  return pSVar2;
}

Assistant:

Span* PageHeap::SearchFreeAndLargeLists(Length n) {
  ASSERT(lock_.IsHeld());
  ASSERT(Check());
  ASSERT(n > 0);

  // Find first size >= n that has a non-empty list
  for (Length s = n; s <= kMaxPages; s++) {
    Span* ll = &free_[s - 1].normal;
    // If we're lucky, ll is non-empty, meaning it has a suitable span.
    if (!DLL_IsEmpty(ll)) {
      ASSERT(ll->next->location == Span::ON_NORMAL_FREELIST);
      return Carve(ll->next, n);
    }
    // Alternatively, maybe there's a usable returned span.
    ll = &free_[s - 1].returned;
    if (!DLL_IsEmpty(ll)) {
      // We did not call EnsureLimit before, to avoid releasing the span
      // that will be taken immediately back.
      // Calling EnsureLimit here is not very expensive, as it fails only if
      // there is no more normal spans (and it fails efficiently)
      // or SystemRelease does not work (there is probably no returned spans).
      if (EnsureLimit(n)) {
        // ll may have became empty due to coalescing
        if (!DLL_IsEmpty(ll)) {
          ASSERT(ll->next->location == Span::ON_RETURNED_FREELIST);
          return Carve(ll->next, n);
        }
      }
    }
  }
  // No luck in free lists, our last chance is in a larger class.
  return AllocLarge(n);  // May be nullptr
}